

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_get_tile(opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_image_t *p_image,
                         opj_event_mgr_t *p_manager,OPJ_UINT32 tile_index)

{
  uint uVar1;
  OPJ_UINT32 OVar2;
  OPJ_INT32 OVar3;
  OPJ_INT32 OVar4;
  OPJ_INT32 OVar5;
  OPJ_BOOL OVar6;
  opj_image_t *poVar7;
  uint uVar8;
  OPJ_INT32 l_comp_y1;
  OPJ_INT32 l_comp_x1;
  opj_image_comp_t *l_img_comp;
  OPJ_UINT32 l_tile_y;
  OPJ_UINT32 l_tile_x;
  OPJ_UINT32 compno;
  OPJ_UINT32 tile_index_local;
  opj_event_mgr_t *p_manager_local;
  opj_image_t *p_image_local;
  opj_stream_private_t *p_stream_local;
  opj_j2k_t *p_j2k_local;
  
  if (p_image == (opj_image_t *)0x0) {
    opj_event_msg(p_manager,1,"We need an image previously created.\n");
    p_j2k_local._4_4_ = 0;
  }
  else if (p_image->numcomps < p_j2k->m_private_image->numcomps) {
    opj_event_msg(p_manager,1,"Image has less components than codestream.\n");
    p_j2k_local._4_4_ = 0;
  }
  else if (tile_index < (p_j2k->m_cp).tw * (p_j2k->m_cp).th) {
    uVar8 = tile_index % (p_j2k->m_cp).tw;
    uVar1 = tile_index / (p_j2k->m_cp).tw;
    p_image->x0 = uVar8 * (p_j2k->m_cp).tdx + (p_j2k->m_cp).tx0;
    if (p_image->x0 < p_j2k->m_private_image->x0) {
      p_image->x0 = p_j2k->m_private_image->x0;
    }
    p_image->x1 = (uVar8 + 1) * (p_j2k->m_cp).tdx + (p_j2k->m_cp).tx0;
    if (p_j2k->m_private_image->x1 < p_image->x1) {
      p_image->x1 = p_j2k->m_private_image->x1;
    }
    p_image->y0 = uVar1 * (p_j2k->m_cp).tdy + (p_j2k->m_cp).ty0;
    if (p_image->y0 < p_j2k->m_private_image->y0) {
      p_image->y0 = p_j2k->m_private_image->y0;
    }
    p_image->y1 = (uVar1 + 1) * (p_j2k->m_cp).tdy + (p_j2k->m_cp).ty0;
    if (p_j2k->m_private_image->y1 < p_image->y1) {
      p_image->y1 = p_j2k->m_private_image->y1;
    }
    _l_comp_y1 = p_image->comps;
    for (l_tile_y = 0; l_tile_y < p_j2k->m_private_image->numcomps; l_tile_y = l_tile_y + 1) {
      _l_comp_y1->factor = p_j2k->m_private_image->comps[l_tile_y].factor;
      OVar2 = opj_int_ceildiv(p_image->x0,_l_comp_y1->dx);
      _l_comp_y1->x0 = OVar2;
      OVar2 = opj_int_ceildiv(p_image->y0,_l_comp_y1->dy);
      _l_comp_y1->y0 = OVar2;
      OVar3 = opj_int_ceildiv(p_image->x1,_l_comp_y1->dx);
      OVar4 = opj_int_ceildiv(p_image->y1,_l_comp_y1->dy);
      OVar3 = opj_int_ceildivpow2(OVar3,_l_comp_y1->factor);
      OVar5 = opj_int_ceildivpow2(_l_comp_y1->x0,_l_comp_y1->factor);
      _l_comp_y1->w = OVar3 - OVar5;
      OVar3 = opj_int_ceildivpow2(OVar4,_l_comp_y1->factor);
      OVar4 = opj_int_ceildivpow2(_l_comp_y1->y0,_l_comp_y1->factor);
      _l_comp_y1->h = OVar3 - OVar4;
      _l_comp_y1 = _l_comp_y1 + 1;
    }
    if (p_j2k->m_private_image->numcomps < p_image->numcomps) {
      for (l_tile_y = p_j2k->m_private_image->numcomps; l_tile_y < p_image->numcomps;
          l_tile_y = l_tile_y + 1) {
        opj_image_data_free(p_image->comps[l_tile_y].data);
        p_image->comps[l_tile_y].data = (OPJ_INT32 *)0x0;
      }
      p_image->numcomps = p_j2k->m_private_image->numcomps;
    }
    if (p_j2k->m_output_image != (opj_image_t *)0x0) {
      opj_image_destroy(p_j2k->m_output_image);
    }
    poVar7 = opj_image_create0();
    p_j2k->m_output_image = poVar7;
    if (p_j2k->m_output_image == (opj_image_t *)0x0) {
      p_j2k_local._4_4_ = 0;
    }
    else {
      opj_copy_image_header(p_image,p_j2k->m_output_image);
      (p_j2k->m_specific_param).m_encoder.m_encoded_tile_size = tile_index;
      OVar6 = opj_j2k_setup_decoding_tile(p_j2k,p_manager);
      if (OVar6 == 0) {
        p_j2k_local._4_4_ = 0;
      }
      else {
        OVar6 = opj_j2k_exec(p_j2k,p_j2k->m_procedure_list,p_stream,p_manager);
        if (OVar6 == 0) {
          opj_image_destroy(p_j2k->m_private_image);
          p_j2k->m_private_image = (opj_image_t *)0x0;
          p_j2k_local._4_4_ = 0;
        }
        else {
          p_j2k_local._4_4_ = opj_j2k_move_data_from_codec_to_output_image(p_j2k,p_image);
        }
      }
    }
  }
  else {
    opj_event_msg(p_manager,1,"Tile index provided by the user is incorrect %d (max = %d) \n",
                  (ulong)tile_index,(ulong)((p_j2k->m_cp).tw * (p_j2k->m_cp).th - 1));
    p_j2k_local._4_4_ = 0;
  }
  return p_j2k_local._4_4_;
}

Assistant:

OPJ_BOOL opj_j2k_get_tile(opj_j2k_t *p_j2k,
                          opj_stream_private_t *p_stream,
                          opj_image_t* p_image,
                          opj_event_mgr_t * p_manager,
                          OPJ_UINT32 tile_index)
{
    OPJ_UINT32 compno;
    OPJ_UINT32 l_tile_x, l_tile_y;
    opj_image_comp_t* l_img_comp;

    if (!p_image) {
        opj_event_msg(p_manager, EVT_ERROR, "We need an image previously created.\n");
        return OPJ_FALSE;
    }

    if (p_image->numcomps < p_j2k->m_private_image->numcomps) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Image has less components than codestream.\n");
        return OPJ_FALSE;
    }

    if (/*(tile_index < 0) &&*/ (tile_index >= p_j2k->m_cp.tw * p_j2k->m_cp.th)) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Tile index provided by the user is incorrect %d (max = %d) \n", tile_index,
                      (p_j2k->m_cp.tw * p_j2k->m_cp.th) - 1);
        return OPJ_FALSE;
    }

    /* Compute the dimension of the desired tile*/
    l_tile_x = tile_index % p_j2k->m_cp.tw;
    l_tile_y = tile_index / p_j2k->m_cp.tw;

    p_image->x0 = l_tile_x * p_j2k->m_cp.tdx + p_j2k->m_cp.tx0;
    if (p_image->x0 < p_j2k->m_private_image->x0) {
        p_image->x0 = p_j2k->m_private_image->x0;
    }
    p_image->x1 = (l_tile_x + 1) * p_j2k->m_cp.tdx + p_j2k->m_cp.tx0;
    if (p_image->x1 > p_j2k->m_private_image->x1) {
        p_image->x1 = p_j2k->m_private_image->x1;
    }

    p_image->y0 = l_tile_y * p_j2k->m_cp.tdy + p_j2k->m_cp.ty0;
    if (p_image->y0 < p_j2k->m_private_image->y0) {
        p_image->y0 = p_j2k->m_private_image->y0;
    }
    p_image->y1 = (l_tile_y + 1) * p_j2k->m_cp.tdy + p_j2k->m_cp.ty0;
    if (p_image->y1 > p_j2k->m_private_image->y1) {
        p_image->y1 = p_j2k->m_private_image->y1;
    }

    l_img_comp = p_image->comps;
    for (compno = 0; compno < p_j2k->m_private_image->numcomps; ++compno) {
        OPJ_INT32 l_comp_x1, l_comp_y1;

        l_img_comp->factor = p_j2k->m_private_image->comps[compno].factor;

        l_img_comp->x0 = (OPJ_UINT32)opj_int_ceildiv((OPJ_INT32)p_image->x0,
                         (OPJ_INT32)l_img_comp->dx);
        l_img_comp->y0 = (OPJ_UINT32)opj_int_ceildiv((OPJ_INT32)p_image->y0,
                         (OPJ_INT32)l_img_comp->dy);
        l_comp_x1 = opj_int_ceildiv((OPJ_INT32)p_image->x1, (OPJ_INT32)l_img_comp->dx);
        l_comp_y1 = opj_int_ceildiv((OPJ_INT32)p_image->y1, (OPJ_INT32)l_img_comp->dy);

        l_img_comp->w = (OPJ_UINT32)(opj_int_ceildivpow2(l_comp_x1,
                                     (OPJ_INT32)l_img_comp->factor) - opj_int_ceildivpow2((OPJ_INT32)l_img_comp->x0,
                                             (OPJ_INT32)l_img_comp->factor));
        l_img_comp->h = (OPJ_UINT32)(opj_int_ceildivpow2(l_comp_y1,
                                     (OPJ_INT32)l_img_comp->factor) - opj_int_ceildivpow2((OPJ_INT32)l_img_comp->y0,
                                             (OPJ_INT32)l_img_comp->factor));

        l_img_comp++;
    }

    if (p_image->numcomps > p_j2k->m_private_image->numcomps) {
        /* Can happen when calling repeatdly opj_get_decoded_tile() on an
         * image with a color palette, where color palette expansion is done
         * later in jp2.c */
        for (compno = p_j2k->m_private_image->numcomps; compno < p_image->numcomps;
                ++compno) {
            opj_image_data_free(p_image->comps[compno].data);
            p_image->comps[compno].data = NULL;
        }
        p_image->numcomps = p_j2k->m_private_image->numcomps;
    }

    /* Destroy the previous output image*/
    if (p_j2k->m_output_image) {
        opj_image_destroy(p_j2k->m_output_image);
    }

    /* Create the ouput image from the information previously computed*/
    p_j2k->m_output_image = opj_image_create0();
    if (!(p_j2k->m_output_image)) {
        return OPJ_FALSE;
    }
    opj_copy_image_header(p_image, p_j2k->m_output_image);

    p_j2k->m_specific_param.m_decoder.m_tile_ind_to_dec = (OPJ_INT32)tile_index;

    /* customization of the decoding */
    if (!opj_j2k_setup_decoding_tile(p_j2k, p_manager)) {
        return OPJ_FALSE;
    }

    /* Decode the codestream */
    if (! opj_j2k_exec(p_j2k, p_j2k->m_procedure_list, p_stream, p_manager)) {
        opj_image_destroy(p_j2k->m_private_image);
        p_j2k->m_private_image = NULL;
        return OPJ_FALSE;
    }

    /* Move data and copy one information from codec to output image*/
    return opj_j2k_move_data_from_codec_to_output_image(p_j2k, p_image);
}